

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Point::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Point *this)

{
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdSolidColor *pMVar2;
  MthdVtxXy *pMVar3;
  MthdVtxX32 *this_01;
  MthdVtxY32 *this_02;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_183;
  undefined1 local_182;
  allocator local_181;
  string local_180 [38];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [38];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [38];
  undefined1 local_92;
  allocator local_91;
  string local_90 [48];
  SingleMthdTest *local_60;
  MthdSolidColor *local_58;
  MthdVtxXy *local_50;
  MthdVtxX32 *local_48;
  MthdVtxY32 *local_40;
  MthdSolidColor *local_38;
  MthdVtxXy *local_30;
  iterator local_28;
  size_type local_20;
  Point *local_18;
  Point *this_local;
  
  local_18 = this;
  this_local = (Point *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_92 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"notify",&local_91);
  MthdNotify::SingleMthdTest
            ((MthdNotify *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_90,-1,
             (this->super_Class).cls,0x104,1,4);
  local_92 = 0;
  local_60 = this_00;
  pMVar2 = (MthdSolidColor *)operator_new(0x25950);
  local_ba = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"color",&local_b9);
  MthdSolidColor::SingleMthdTest
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_b8,-1,
             (this->super_Class).cls,0x304,1,4);
  local_ba = 0;
  local_58 = pMVar2;
  pMVar3 = (MthdVtxXy *)operator_new(0x25958);
  local_e2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"point.xy",&local_e1);
  MthdVtxXy::MthdVtxXy
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_e0,-1,
             (this->super_Class).cls,0x400,0x20,4,5);
  local_e2 = 0;
  local_50 = pMVar3;
  this_01 = (MthdVtxX32 *)operator_new(0x25958);
  local_10a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"point32.x",&local_109);
  MthdVtxX32::MthdVtxX32
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_108,-1,
             (this->super_Class).cls,0x480,0x10,8,5);
  local_10a = 0;
  local_48 = this_01;
  this_02 = (MthdVtxY32 *)operator_new(0x25958);
  local_132 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"point32.y",&local_131);
  MthdVtxY32::MthdVtxY32
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_130,-1,
             (this->super_Class).cls,0x484,0x10,8,5);
  local_132 = 0;
  local_40 = this_02;
  pMVar2 = (MthdSolidColor *)operator_new(0x25950);
  local_15a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"cpoint.color",&local_159);
  MthdSolidColor::SingleMthdTest
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_158,-1,
             (this->super_Class).cls,0x500,0x10,8);
  local_15a = 0;
  local_38 = pMVar2;
  pMVar3 = (MthdVtxXy *)operator_new(0x25958);
  local_182 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"cpoint.xy",&local_181);
  MthdVtxXy::MthdVtxXy
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_180,-1,
             (this->super_Class).cls,0x504,0x10,8,5);
  local_182 = 0;
  local_28 = &local_60;
  local_20 = 7;
  local_30 = pMVar3;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_183);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_183);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_183);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Point::mthds() {
	return {
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdSolidColor(opt, rnd(), "color", -1, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "point.xy", -1, cls, 0x400, 0x20, 4, VTX_FIRST | VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "point32.x", -1, cls, 0x480, 0x10, 8, VTX_FIRST | VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "point32.y", -1, cls, 0x484, 0x10, 8, VTX_FIRST | VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "cpoint.color", -1, cls, 0x500, 0x10, 8),
		new MthdVtxXy(opt, rnd(), "cpoint.xy", -1, cls, 0x504, 0x10, 8, VTX_FIRST | VTX_DRAW),
	};
}